

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_1::TriangleStripCase::generateTriangles
          (TriangleStripCase *this,int iteration,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outData,
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          *outTriangles)

{
  ostringstream *poVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  pointer pVVar11;
  pointer pSVar12;
  ulong uVar13;
  undefined8 uVar14;
  int vtxNdx;
  long lVar15;
  long lVar16;
  undefined1 local_1b0 [384];
  
  uVar13 = (ulong)(uint)iteration;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(outData,5);
  if ((uint)iteration < 3) {
    fVar2 = *(float *)(&DAT_0181b75c + uVar13 * 4);
    fVar3 = *(float *)(&DAT_0181b768 + uVar13 * 4);
    fVar4 = *(float *)(&DAT_0181b774 + uVar13 * 4);
    fVar5 = *(float *)(&DAT_0181b780 + uVar13 * 4);
    fVar6 = *(float *)(&DAT_0181b78c + uVar13 * 4);
    fVar7 = *(float *)(&DAT_0181b798 + uVar13 * 4);
    fVar8 = *(float *)(&DAT_0181b7a4 + uVar13 * 4);
    fVar9 = *(float *)(&DAT_0181b7b0 + uVar13 * 4);
    fVar10 = *(float *)(&DAT_0181b7bc + uVar13 * 4);
    pVVar11 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar11->m_data[0] = *(float *)(&DAT_0181b750 + uVar13 * 4);
    pVVar11->m_data[1] = fVar2;
    pVVar11->m_data[2] = 0.0;
    pVVar11->m_data[3] = 1.0;
    pVVar11 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar11[1].m_data[0] = fVar3;
    pVVar11[1].m_data[1] = fVar4;
    pVVar11[1].m_data[2] = 0.0;
    pVVar11[1].m_data[3] = 1.0;
    pVVar11 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar11[2].m_data[0] = fVar5;
    pVVar11[2].m_data[1] = fVar6;
    pVVar11[2].m_data[2] = 0.0;
    pVVar11[2].m_data[3] = 1.0;
    pVVar11 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar11[3].m_data[0] = fVar7;
    pVVar11[3].m_data[1] = fVar8;
    pVVar11[3].m_data[2] = 0.0;
    pVVar11[3].m_data[3] = 1.0;
    pVVar11 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar11[4].m_data[0] = fVar9;
    pVVar11[4].m_data[1] = fVar10;
    pVVar11[4].m_data[2] = 0.0;
    pVVar11[4].m_data[3] = 1.0;
  }
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::resize(outTriangles,3);
  pVVar11 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pSVar12 = (outTriangles->
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar14 = *(undefined8 *)(pVVar11->m_data + 2);
  *(undefined8 *)pSVar12->positions[0].m_data = *(undefined8 *)pVVar11->m_data;
  *(undefined8 *)(pSVar12->positions[0].m_data + 2) = uVar14;
  pSVar12 = (outTriangles->
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar12->sharedEdge[0] = false;
  pVVar11 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar14 = *(undefined8 *)(pVVar11[1].m_data + 2);
  *(undefined8 *)pSVar12->positions[1].m_data = *(undefined8 *)pVVar11[1].m_data;
  *(undefined8 *)(pSVar12->positions[1].m_data + 2) = uVar14;
  pSVar12 = (outTriangles->
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar12->sharedEdge[1] = true;
  pVVar11 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar14 = *(undefined8 *)(pVVar11[2].m_data + 2);
  *(undefined8 *)pSVar12->positions[2].m_data = *(undefined8 *)pVVar11[2].m_data;
  *(undefined8 *)(pSVar12->positions[2].m_data + 2) = uVar14;
  pSVar12 = (outTriangles->
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar12->sharedEdge[2] = false;
  pVVar11 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar14 = *(undefined8 *)(pVVar11[2].m_data + 2);
  *(undefined8 *)pSVar12[1].positions[0].m_data = *(undefined8 *)pVVar11[2].m_data;
  *(undefined8 *)(pSVar12[1].positions[0].m_data + 2) = uVar14;
  pSVar12 = (outTriangles->
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar12[1].sharedEdge[0] = true;
  pVVar11 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar14 = *(undefined8 *)(pVVar11[1].m_data + 2);
  *(undefined8 *)pSVar12[1].positions[1].m_data = *(undefined8 *)pVVar11[1].m_data;
  *(undefined8 *)(pSVar12[1].positions[1].m_data + 2) = uVar14;
  pSVar12 = (outTriangles->
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar12[1].sharedEdge[1] = false;
  pVVar11 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar14 = *(undefined8 *)(pVVar11[3].m_data + 2);
  *(undefined8 *)pSVar12[1].positions[2].m_data = *(undefined8 *)pVVar11[3].m_data;
  *(undefined8 *)(pSVar12[1].positions[2].m_data + 2) = uVar14;
  pSVar12 = (outTriangles->
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar12[1].sharedEdge[2] = true;
  pVVar11 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar14 = *(undefined8 *)(pVVar11[2].m_data + 2);
  *(undefined8 *)pSVar12[2].positions[0].m_data = *(undefined8 *)pVVar11[2].m_data;
  *(undefined8 *)(pSVar12[2].positions[0].m_data + 2) = uVar14;
  pSVar12 = (outTriangles->
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar12[2].sharedEdge[0] = true;
  pVVar11 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar14 = *(undefined8 *)(pVVar11[3].m_data + 2);
  *(undefined8 *)pSVar12[2].positions[1].m_data = *(undefined8 *)pVVar11[3].m_data;
  *(undefined8 *)(pSVar12[2].positions[1].m_data + 2) = uVar14;
  pSVar12 = (outTriangles->
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar12[2].sharedEdge[1] = false;
  pVVar11 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar14 = *(undefined8 *)(pVVar11[4].m_data + 2);
  *(undefined8 *)pSVar12[2].positions[2].m_data = *(undefined8 *)pVVar11[4].m_data;
  *(undefined8 *)(pSVar12[2].positions[2].m_data + 2) = uVar14;
  (outTriangles->
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  )._M_impl.super__Vector_impl_data._M_start[2].sharedEdge[2] = false;
  local_1b0._0_8_ =
       ((this->super_BaseTriangleCase).super_BaseRenderingCase.super_TestCase.super_TestCase.
        super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Rendering triangle strip, ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1," vertices.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  lVar16 = 0;
  for (lVar15 = 0;
      lVar15 < (int)((ulong)((long)(outData->
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(outData->
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 4);
      lVar15 = lVar15 + 1) {
    local_1b0._0_8_ =
         ((this->super_BaseTriangleCase).super_BaseRenderingCase.super_TestCase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"\t");
    tcu::operator<<((ostream *)poVar1,
                    (Vector<float,_4> *)
                    ((long)((outData->
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    lVar16 = lVar16 + 0x10;
  }
  return;
}

Assistant:

void TriangleStripCase::generateTriangles (int iteration, std::vector<tcu::Vec4>& outData, std::vector<TriangleSceneSpec::SceneTriangle>& outTriangles)
{
	outData.resize(5);

	switch (iteration)
	{
		case 0:
			// \note: these values are chosen arbitrarily
			outData[0] = tcu::Vec4(-0.504f,  0.8f,   0.0f, 1.0f);
			outData[1] = tcu::Vec4(-0.2f,   -0.2f,   0.0f, 1.0f);
			outData[2] = tcu::Vec4(-0.2f,    0.199f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4( 0.5f,    0.201f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4( 1.5f,    0.4f,   0.0f, 1.0f);
			break;

		case 1:
			outData[0] = tcu::Vec4(-0.499f, 0.129f,  0.0f, 1.0f);
			outData[1] = tcu::Vec4(-0.501f,  -0.3f,  0.0f, 1.0f);
			outData[2] = tcu::Vec4(  0.11f,  -0.2f,  0.0f, 1.0f);
			outData[3] = tcu::Vec4(  0.11f,  -0.31f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4(  0.88f,   0.9f,  0.0f, 1.0f);
			break;

		case 2:
			outData[0] = tcu::Vec4( -0.9f, -0.3f,  0.0f, 1.0f);
			outData[1] = tcu::Vec4(  1.1f, -0.9f,  0.0f, 1.0f);
			outData[2] = tcu::Vec4(-0.87f, -0.1f,  0.0f, 1.0f);
			outData[3] = tcu::Vec4(-0.11f,  0.19f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4( 0.88f,  0.7f,  0.0f, 1.0f);
			break;
	}

	outTriangles.resize(3);
	outTriangles[0].positions[0] = outData[0];	outTriangles[0].sharedEdge[0] = false;
	outTriangles[0].positions[1] = outData[1];	outTriangles[0].sharedEdge[1] = true;
	outTriangles[0].positions[2] = outData[2];	outTriangles[0].sharedEdge[2] = false;

	outTriangles[1].positions[0] = outData[2];	outTriangles[1].sharedEdge[0] = true;
	outTriangles[1].positions[1] = outData[1];	outTriangles[1].sharedEdge[1] = false;
	outTriangles[1].positions[2] = outData[3];	outTriangles[1].sharedEdge[2] = true;

	outTriangles[2].positions[0] = outData[2];	outTriangles[2].sharedEdge[0] = true;
	outTriangles[2].positions[1] = outData[3];	outTriangles[2].sharedEdge[1] = false;
	outTriangles[2].positions[2] = outData[4];	outTriangles[2].sharedEdge[2] = false;

	// log
	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering triangle strip, " << outData.size() << " vertices." << tcu::TestLog::EndMessage;
	for (int vtxNdx = 0; vtxNdx < (int)outData.size(); ++vtxNdx)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "\t" << outData[vtxNdx]
			<< tcu::TestLog::EndMessage;
	}
}